

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtext.c
# Opt level: O2

char * TextToSnake(char *text)

{
  char cVar1;
  uint uVar2;
  
  uVar2 = 0;
  memset(TextToSnake::buffer,0,0x400);
  if (text != (char *)0x0) {
    for (; ((int)uVar2 < 0x3ff && (cVar1 = *text, cVar1 != '\0')); text = text + 1) {
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        if (0 < (int)uVar2) {
          TextToSnake::buffer[uVar2] = '_';
          uVar2 = uVar2 + 1;
          cVar1 = *text;
        }
        cVar1 = cVar1 + ' ';
      }
      TextToSnake::buffer[(int)uVar2] = cVar1;
      uVar2 = uVar2 + 1;
    }
  }
  return TextToSnake::buffer;
}

Assistant:

const char *TextToSnake(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = {0};
    memset(buffer, 0, MAX_TEXT_BUFFER_LENGTH);

    if (text != NULL)
    {
        // Check for next separator to upper case another character
        for (int i = 0, j = 0; (i < MAX_TEXT_BUFFER_LENGTH - 1) && (text[j] != '\0'); i++, j++)
        {
            if ((text[j] >= 'A') && (text[j] <= 'Z'))
            {
                if (i >= 1)
                {
                    buffer[i] = '_';
                    i++;
                }
                buffer[i] = text[j] + 32;
            }
            else buffer[i] = text[j];
        }
    }

    return buffer;
}